

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall
tcu::x11::XlibDisplay::XlibDisplay(XlibDisplay *this,EventState *eventState,char *name)

{
  Display *pDVar1;
  ResourceError *this_00;
  Atom AVar2;
  char *name_local;
  EventState *eventState_local;
  XlibDisplay *this_local;
  
  DisplayBase::DisplayBase(&this->super_DisplayBase,eventState);
  (this->super_DisplayBase)._vptr_DisplayBase = (_func_int **)&PTR__XlibDisplay_0169bb30;
  pDVar1 = (Display *)XOpenDisplay(name);
  this->m_display = pDVar1;
  if (this->m_display == (Display *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    ResourceError::ResourceError
              (this_00,"Failed to open display",name,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
               ,0x4f);
    __cxa_throw(this_00,&ResourceError::typeinfo,ResourceError::~ResourceError);
  }
  AVar2 = XInternAtom(this->m_display,"WM_DELETE_WINDOW",0);
  this->m_deleteAtom = AVar2;
  return;
}

Assistant:

XlibDisplay::XlibDisplay (EventState& eventState, const char* name)
	: DisplayBase	(eventState)
{
	m_display = XOpenDisplay((char*)name); // Won't modify argument string.
	if (!m_display)
		throw ResourceError("Failed to open display", name, __FILE__, __LINE__);

	m_deleteAtom	= XInternAtom(m_display, "WM_DELETE_WINDOW", False);
}